

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::internal::UnknownFieldParserHelper>
                 (UnknownFieldParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  uint32_t res;
  uint uVar5;
  byte *unaff_R12;
  pair<const_char_*,_unsigned_int> pVar6;
  byte *local_28;
  
  local_28 = (byte *)ptr;
  do {
    bVar4 = EpsCopyInputStream::DoneWithCheck<false>
                      (&ctx->super_EpsCopyInputStream,(char **)&local_28,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_28;
    }
    bVar1 = *local_28;
    auVar3[8] = bVar1;
    auVar3._0_8_ = local_28 + 1;
    auVar3._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_28[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar6 = ReadTagFallback((char *)local_28,res);
        auVar3 = pVar6._0_12_;
      }
      else {
        auVar3._8_4_ = res;
        auVar3._0_8_ = local_28 + 2;
      }
    }
    local_28 = auVar3._0_8_;
    if (local_28 == (byte *)0x0) {
      unaff_R12 = (byte *)0x0;
LAB_010045fa:
      bVar4 = false;
    }
    else {
      uVar5 = auVar3._8_4_;
      if (uVar5 == 0 || (uVar5 & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
        unaff_R12 = local_28;
        goto LAB_010045fa;
      }
      local_28 = (byte *)FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                                   ((ulong)uVar5,field_parser,(char *)local_28,ctx);
      bVar4 = local_28 != (byte *)0x0;
      if (!bVar4) {
        unaff_R12 = (byte *)0x0;
      }
    }
    if (!bVar4) {
      return (char *)unaff_R12;
    }
  } while( true );
}

Assistant:

[[nodiscard]] const char* WireFormatParser(T& field_parser, const char* ptr,
                                           ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}